

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O3

void __thiscall jaegertracing::Config_testFromEnv_Test::TestBody(Config_testFromEnv_Test *this)

{
  size_type *psVar1;
  string *rhs;
  string *rhs_00;
  duration *rhs_01;
  char cVar2;
  char *pcVar3;
  AssertionResult *this_00;
  AssertionResult *this_01;
  AssertionResult gtest_ar_2;
  undefined1 local_408 [16];
  _Alloc_hider local_3f8;
  char local_3e8 [16];
  _Alloc_hider local_3d8;
  char local_3c8 [16];
  _Alloc_hider local_3b8;
  char local_3a8 [16];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> expectedTags;
  _Alloc_hider local_370;
  char local_360 [32];
  AssertionResult gtest_ar_19;
  _Alloc_hider local_328;
  char local_318 [16];
  _Alloc_hider local_308;
  char local_2f8 [16];
  undefined1 local_2e8 [8];
  _Alloc_hider local_2e0;
  char local_2d0 [16];
  duration local_2c0;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  duration local_280;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  duration local_1d8;
  Config config;
  
  this_00 = &gtest_ar_2;
  this_01 = &gtest_ar_2;
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = &config._serviceName._M_string_length;
  config._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&config,"foo","");
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[9],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&tags,
             (char (*) [9])"hostname",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config);
  if ((size_type *)config._0_8_ != psVar1) {
    operator_delete((void *)config._0_8_);
  }
  config._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&config,"1.2.3","");
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[15],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&tags,
             (char (*) [15])"my.app.version",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config);
  if ((size_type *)config._0_8_ != psVar1) {
    operator_delete((void *)config._0_8_);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"probabilistic","");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"http://host34:57/sampling","");
  local_1d8.__r = 0;
  samplers::Config::Config((Config *)&expectedTags,&local_238,0.7,&local_258,0,&local_1d8);
  local_280.__r = 100000000;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"host35:77","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"http://host36:56568","");
  reporters::Config::Config((Config *)&gtest_ar_19,10,&local_280,false,&local_278,&local_218);
  propagation::HeadersConfig::HeadersConfig((HeadersConfig *)&gtest_ar_2);
  local_2a0 = local_290;
  pcVar3 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"","");
  local_2e8[0] = (AssertHelper)0x0;
  local_2e0._M_p = local_2d0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2e0,local_2a0,local_2a0 + local_298);
  local_2c0.__r = 0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"test-service","");
  Config::Config(&config,false,(Config *)&expectedTags,(Config *)&gtest_ar_19,
                 (HeadersConfig *)&gtest_ar_2,(RestrictionsConfig *)local_2e8,&local_1f8,&tags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_2e0._M_p != local_2d0) {
    operator_delete(local_2e0._M_p);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  if (local_3b8._M_p != local_3a8) {
    operator_delete(local_3b8._M_p);
  }
  if (local_3d8._M_p != local_3c8) {
    operator_delete(local_3d8._M_p);
  }
  if (local_3f8._M_p != local_3e8) {
    operator_delete(local_3f8._M_p);
  }
  if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if (local_308._M_p != local_2f8) {
    operator_delete(local_308._M_p);
  }
  if (local_328._M_p != local_318) {
    operator_delete(local_328._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_370._M_p != local_360) {
    operator_delete(local_370._M_p);
  }
  if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&expectedTags.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(expectedTags.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  jaegertracing::Config::fromEnv();
  gtest_ar_2._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"http://host36:56568","");
  rhs = &config._reporter._endpoint;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&expectedTags,"std::string(\"http://host36:56568\")",
             "config.reporter().endpoint()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,rhs);
  if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((char)expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      pcVar3 = ((expectedTags.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (gtest_ar_2._0_8_ != 0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (gtest_ar_2._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&expectedTags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_2._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"host35:77","");
  rhs_00 = &config._reporter._localAgentHostPort;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&expectedTags,"std::string(\"host35:77\")",
             "config.reporter().localAgentHostPort()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,rhs_00
            );
  if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((char)expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((expectedTags.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (gtest_ar_2._0_8_ != 0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (gtest_ar_2._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&expectedTags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expectedTags.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,10);
  gtest_ar_19._0_4_ = config._reporter._queueSize;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"10","config.reporter().queueSize()",(int *)&expectedTags,
             (int *)&gtest_ar_19);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x7e,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((expectedTags.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000064;
  rhs_01 = &config._reporter._bufferFlushInterval;
  testing::internal::
  CmpHelperEQ<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((internal *)&gtest_ar_2,"std::chrono::milliseconds(100)",
             "config.reporter().bufferFlushInterval()",
             (duration<long,_std::ratio<1L,_1000L>_> *)&expectedTags,rhs_01);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((expectedTags.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)expectedTags.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  gtest_ar_19.success_ = config._reporter._logSpans;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_2,"false","config.reporter().logSpans()",(bool *)&expectedTags,
             &gtest_ar_19.success_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((expectedTags.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_3fe6666666666666;
  gtest_ar_19._0_8_ = config._sampler._param;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_2,".7","config.sampler().param()",(double *)&expectedTags,
             (double *)&gtest_ar_19);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((expectedTags.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_2._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"probabilistic","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&expectedTags,"std::string(\"probabilistic\")","config.sampler().type()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
             &config._sampler._type);
  if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((char)expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((expectedTags.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (gtest_ar_2._0_8_ != 0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (gtest_ar_2._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&expectedTags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  setenv("JAEGER_AGENT_HOST","host33",1);
  setenv("JAEGER_AGENT_PORT","45",1);
  setenv("JAEGER_ENDPOINT","http://host34:56567",1);
  setenv("JAEGER_REPORTER_MAX_QUEUE_SIZE","33",1);
  setenv("JAEGER_REPORTER_FLUSH_INTERVAL","45",1);
  setenv("JAEGER_REPORTER_LOG_SPANS","true",1);
  setenv("JAEGER_SAMPLER_TYPE","remote",1);
  setenv("JAEGER_SAMPLER_PARAM","0.33",1);
  setenv("JAEGER_SAMPLING_ENDPOINT","http://myagent:1234",1);
  setenv("JAEGER_SERVICE_NAME","AService",1);
  setenv("JAEGER_TAGS","hostname=foobar,my.app.version=4.5.6",1);
  jaegertracing::Config::fromEnv();
  gtest_ar_2._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"http://host34:56567","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&expectedTags,"std::string(\"http://host34:56567\")",
             "config.reporter().endpoint()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,rhs);
  if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((char)expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((expectedTags.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (gtest_ar_2._0_8_ != 0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (gtest_ar_2._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&expectedTags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_2._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"host33:45","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&expectedTags,"std::string(\"host33:45\")",
             "config.reporter().localAgentHostPort()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,rhs_00
            );
  if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((char)expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((expectedTags.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (gtest_ar_2._0_8_ != 0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (gtest_ar_2._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&expectedTags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expectedTags.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x21);
  gtest_ar_19._0_4_ = config._reporter._queueSize;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"33","config.reporter().queueSize()",(int *)&expectedTags,
             (int *)&gtest_ar_19);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((expectedTags.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_0000002d;
  testing::internal::
  CmpHelperEQ<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((internal *)&gtest_ar_2,"std::chrono::milliseconds(45)",
             "config.reporter().bufferFlushInterval()",
             (duration<long,_std::ratio<1L,_1000L>_> *)&expectedTags,rhs_01);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((expectedTags.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(expectedTags.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  gtest_ar_19.success_ = config._reporter._logSpans;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_2,"true","config.reporter().logSpans()",(bool *)&expectedTags,
             &gtest_ar_19.success_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x9d,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((expectedTags.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_2.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0017cb53;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_2._0_8_ = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"remote","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&expectedTags,"std::string(\"remote\")","config.sampler().type()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
             &config._sampler._type);
  if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  if ((char)expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((expectedTags.
                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    goto LAB_0017cab7;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&expectedTags);
  expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fd51eb851eb851f;
  gtest_ar_19._0_8_ = config._sampler._param;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_2,"0.33","config.sampler().param()",(double *)&expectedTags,
             (double *)&gtest_ar_19);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&expectedTags);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_19,(Message *)&expectedTags);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    testing::Message::~Message((Message *)&expectedTags);
  }
  else {
    testing::AssertionResult::~AssertionResult(&gtest_ar_2);
    gtest_ar_2._0_8_ = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"http://myagent:1234","");
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&expectedTags,"std::string(\"http://myagent:1234\")",
               "config.sampler().samplingServerURL()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
               &config._sampler._samplingServerURL);
    if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
      operator_delete((void *)gtest_ar_2._0_8_);
    }
    if ((char)expectedTags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_2);
      if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((expectedTags.
                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                 ,0xa1,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)&expectedTags);
      gtest_ar_2._0_8_ = local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"AService","");
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&expectedTags,"std::string(\"AService\")","config.serviceName()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
                 &config._serviceName);
      if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
        operator_delete((void *)gtest_ar_2._0_8_);
      }
      if ((char)expectedTags.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_start != '\0') {
        testing::AssertionResult::~AssertionResult((AssertionResult *)&expectedTags);
        expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        gtest_ar_2._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"foo","");
        std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
        emplace_back<char_const(&)[9],std::__cxx11::string>
                  ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&expectedTags,
                   (char (*) [9])"hostname",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2)
        ;
        if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
          operator_delete((void *)gtest_ar_2._0_8_);
        }
        gtest_ar_2._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"1.2.3","");
        std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
        emplace_back<char_const(&)[15],std::__cxx11::string>
                  ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&expectedTags,
                   (char (*) [15])"my.app.version",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2)
        ;
        if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
          operator_delete((void *)gtest_ar_2._0_8_);
        }
        gtest_ar_2._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"foobar","");
        std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
        emplace_back<char_const(&)[9],std::__cxx11::string>
                  ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&expectedTags,
                   (char (*) [9])"hostname",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2)
        ;
        if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
          operator_delete((void *)gtest_ar_2._0_8_);
        }
        gtest_ar_2._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"4.5.6","");
        std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
        emplace_back<char_const(&)[15],std::__cxx11::string>
                  ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)&expectedTags,
                   (char (*) [15])"my.app.version",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2)
        ;
        if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
          operator_delete((void *)gtest_ar_2._0_8_);
        }
        testing::internal::
        CmpHelperEQ<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                  ((internal *)&gtest_ar_2,"expectedTags","config.tags()",&expectedTags,
                   &config._tags);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_19);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                     ,0xaa,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2e8,(Message *)&gtest_ar_19);
LAB_0017cd30:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
          testing::Message::~Message((Message *)&gtest_ar_19);
LAB_0017cd4d:
          testing::AssertionResult::~AssertionResult(this_01);
        }
        else {
          testing::AssertionResult::~AssertionResult(&gtest_ar_2);
          gtest_ar_19._0_8_ = gtest_ar_19._0_8_ & 0xffffffffffffff00;
          local_2e8[0] = (AssertHelper)config._disabled;
          testing::internal::CmpHelperEQ<bool,bool>
                    ((internal *)&gtest_ar_2,"false","config.disabled()",&gtest_ar_19.success_,
                     (bool *)local_2e8);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_19);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                       ,0xac,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2e8,(Message *)&gtest_ar_19);
            goto LAB_0017cd30;
          }
          testing::AssertionResult::~AssertionResult(&gtest_ar_2);
          setenv("JAEGER_DISABLED","TRue",1);
          setenv("JAEGER_AGENT_PORT","445",1);
          jaegertracing::Config::fromEnv();
          gtest_ar_19.success_ = true;
          local_2e8[0] = (AssertHelper)config._disabled;
          testing::internal::CmpHelperEQ<bool,bool>
                    ((internal *)&gtest_ar_2,"true","config.disabled()",&gtest_ar_19.success_,
                     (bool *)local_2e8);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_19);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                       ,0xb2,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2e8,(Message *)&gtest_ar_19);
            goto LAB_0017cd30;
          }
          testing::AssertionResult::~AssertionResult(&gtest_ar_2);
          gtest_ar_2._0_8_ = local_408;
          std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_2,"host33:445","");
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)&gtest_ar_19,"std::string(\"host33:445\")",
                     "config.reporter().localAgentHostPort()",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_ar_2,rhs_00);
          if ((undefined1 *)gtest_ar_2._0_8_ != local_408) {
            operator_delete((void *)gtest_ar_2._0_8_);
          }
          if (gtest_ar_19.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_2);
            if (gtest_ar_19.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar_19.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                       ,0xb4,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2e8,(Message *)&gtest_ar_2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
            testing::Message::~Message((Message *)&gtest_ar_2);
            this_01 = &gtest_ar_19;
            goto LAB_0017cd4d;
          }
          testing::AssertionResult::~AssertionResult(&gtest_ar_19);
          setenv("JAEGER_AGENT_HOST","",1);
          setenv("JAEGER_AGENT_PORT","",1);
          setenv("JAEGER_ENDPOINT","",1);
          setenv("JAEGER_REPORTER_MAX_QUEUE_SIZE","",1);
          setenv("JAEGER_REPORTER_FLUSH_INTERVAL","",1);
          setenv("JAEGER_REPORTER_LOG_SPANS","",1);
          setenv("JAEGER_SAMPLER_PARAM","",1);
          setenv("JAEGER_SAMPLER_TYPE","",1);
          setenv("JAEGER_SERVICE_NAME","",1);
          setenv("JAEGER_TAGS","",1);
          setenv("JAEGER_DISABLED","",1);
        }
        std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&expectedTags)
        ;
        goto LAB_0017cb53;
      }
      testing::Message::Message((Message *)&gtest_ar_2);
      if (expectedTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((expectedTags.
                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->_key)._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                 ,0xa3,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_19,(Message *)&gtest_ar_2);
    }
LAB_0017cab7:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19);
    testing::Message::~Message((Message *)&gtest_ar_2);
    this_00 = (AssertionResult *)&expectedTags;
  }
  testing::AssertionResult::~AssertionResult(this_00);
LAB_0017cb53:
  Config::~Config(&config);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&tags);
  return;
}

Assistant:

TEST(Config, testFromEnv)
{
    std::vector<Tag> tags;
    tags.emplace_back("hostname", std::string("foo"));
    tags.emplace_back("my.app.version", std::string("1.2.3"));

    Config config(false,
                  samplers::Config("probabilistic",
                                   0.7,
                                   "http://host34:57/sampling",
                                   0,
                                   samplers::Config::Clock::duration()),
                  reporters::Config(10,
                                    std::chrono::milliseconds(100),
                                    false,
                                    "host35:77",
                                    "http://host36:56568"),
                  propagation::HeadersConfig(),
                  baggage::RestrictionsConfig(),
                  "test-service",
                  tags);

    config.fromEnv();

    ASSERT_EQ(std::string("http://host36:56568"), config.reporter().endpoint());
    ASSERT_EQ(std::string("host35:77"), config.reporter().localAgentHostPort());

    ASSERT_EQ(10, config.reporter().queueSize());
    ASSERT_EQ(std::chrono::milliseconds(100),
              config.reporter().bufferFlushInterval());
    ASSERT_EQ(false, config.reporter().logSpans());

    ASSERT_EQ(.7, config.sampler().param());
    ASSERT_EQ(std::string("probabilistic"), config.sampler().type());

    testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST", "host33");
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "45");
    testutils::EnvVariable::setEnv("JAEGER_ENDPOINT", "http://host34:56567");

    testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE", "33");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL", "45");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS", "true");

    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE", "remote");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM", "0.33");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLING_ENDPOINT", "http://myagent:1234");

    testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME", "AService");
    testutils::EnvVariable::setEnv("JAEGER_TAGS", "hostname=foobar,my.app.version=4.5.6");

    config.fromEnv();

    ASSERT_EQ(std::string("http://host34:56567"), config.reporter().endpoint());
    ASSERT_EQ(std::string("host33:45"), config.reporter().localAgentHostPort());

    ASSERT_EQ(33, config.reporter().queueSize());
    ASSERT_EQ(std::chrono::milliseconds(45),
              config.reporter().bufferFlushInterval());
    ASSERT_EQ(true, config.reporter().logSpans());

    ASSERT_EQ(std::string("remote"), config.sampler().type());
    ASSERT_EQ(0.33, config.sampler().param());
    ASSERT_EQ(std::string("http://myagent:1234"), config.sampler().samplingServerURL());

    ASSERT_EQ(std::string("AService"), config.serviceName());

    std::vector<Tag> expectedTags;
    expectedTags.emplace_back("hostname", std::string("foo"));
    expectedTags.emplace_back("my.app.version", std::string("1.2.3"));
    expectedTags.emplace_back("hostname", std::string("foobar"));
    expectedTags.emplace_back("my.app.version", std::string("4.5.6"));
    ASSERT_EQ(expectedTags, config.tags());

    ASSERT_EQ(false, config.disabled());

    testutils::EnvVariable::setEnv("JAEGER_DISABLED", "TRue");  // case-insensitive
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "445");

    config.fromEnv();
    ASSERT_EQ(true, config.disabled());
    ASSERT_EQ(std::string("host33:445"),
              config.reporter().localAgentHostPort());

    testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST", "");
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "");
    testutils::EnvVariable::setEnv("JAEGER_ENDPOINT", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS", "");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM", "");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE", "");
    testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME", "");
    testutils::EnvVariable::setEnv("JAEGER_TAGS", "");
    testutils::EnvVariable::setEnv("JAEGER_DISABLED", "");
}